

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::SingleVertexArrayOffsetGroup::init
          (SingleVertexArrayOffsetGroup *this,EVP_PKEY_CTX *ctx)

{
  int t;
  InputType type;
  GLValue min_;
  GLValue max_;
  int in_EAX;
  int iVar1;
  int iVar2;
  MultiVertexArrayTest *this_00;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  InputType IVar7;
  GLValue GVar8;
  GLValue GVar9;
  undefined4 uStack_174;
  undefined4 uStack_164;
  Spec spec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string name;
  ArraySpec arraySpec;
  
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
        IVar7 = this->m_type & ~INPUTTYPE_FIXED;
        if (lVar5 == 0) {
          iVar1 = deqp::gls::Array::inputTypeSize(this->m_type);
          iVar1 = iVar1 << (IVar7 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) + 1;
        }
        else {
          iVar1 = *(int *)((long)&DAT_009bcd50 + lVar5);
        }
        iVar2 = deqp::gls::Array::inputTypeSize(this->m_type);
        iVar4 = iVar2 * 4;
        if (IVar7 != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          iVar4 = iVar2;
        }
        iVar2 = (&DAT_009bcb10)[lVar6];
        typeToString<int>(&local_b0,iVar2);
        std::operator+(&local_130,"offset",&local_b0);
        std::operator+(&local_110,&local_130,"_stride");
        typeToString<int>(&local_d0,iVar1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                       &local_110,&local_d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &arraySpec,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                       "_quads");
        t = (&DAT_009bd238)[lVar3];
        typeToString<int>(&local_f0,t);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &arraySpec,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&arraySpec);
        std::__cxx11::string::~string((string *)&spec);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_b0);
        type = this->m_type;
        GVar8 = deqp::gls::GLValue::getMinValue(type);
        GVar9 = deqp::gls::GLValue::getMaxValue(this->m_type);
        max_._4_4_ = uStack_174;
        max_.type = GVar9.type;
        min_._4_4_ = uStack_164;
        min_.type = GVar8.type;
        min_.field_1 = GVar8.field_1;
        max_.field_1 = GVar9.field_1;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  (&arraySpec,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,
                   (uint)(IVar7 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) * 2 + 2,iVar2,iVar1,false,min_
                   ,max_);
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        spec.primitive = PRIMITIVE_TRIANGLES;
        spec.first = 0;
        spec.drawCount = t;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ::push_back(&spec.arrays,&arraySpec);
        if (iVar1 % iVar4 == 0 && iVar2 % iVar4 == 0) {
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,&spec,
                     name._M_dataplus._M_p,name._M_dataplus._M_p);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        }
        std::
        _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ::~_Vector_base(&spec.arrays.
                         super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       );
        std::__cxx11::string::~string((string *)&name);
      }
    }
    in_EAX = 2;
  }
  return in_EAX;
}

Assistant:

void SingleVertexArrayOffsetGroup::init (void)
{
	int					counts[]		= {1, 256};
	int					offsets[]		= {1, 4, 17, 32};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				const bool			packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
				const int			componentCount	= (packed) ? (4) : (2);
				const int			stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(m_type) * componentCount : strides[strideNdx]);
				const int			alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
				const bool			aligned			= ((stride % alignment) == 0) && ((offsets[offsetNdx] % alignment) == 0);
				const std::string	name			= "offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(stride) + "_quads" + typeToString(counts[countNdx]);

				MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																Array::OUTPUTTYPE_VEC2,
																Array::STORAGE_BUFFER,
																Array::USAGE_DYNAMIC_DRAW,
																componentCount,
																offsets[offsetNdx],
																stride,
																false,
																GLValue::getMinValue(m_type),
																GLValue::getMaxValue(m_type));

				MultiVertexArrayTest::Spec spec;
				spec.primitive	= Array::PRIMITIVE_TRIANGLES;
				spec.drawCount	= counts[countNdx];
				spec.first		= 0;
				spec.arrays.push_back(arraySpec);

				if (aligned)
					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
			}
		}
	}
}